

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O0

int ssl_parse_server_hello(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_handshake_params *pmVar1;
  ulong uVar2;
  uchar *puVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  size_t sVar11;
  mbedtls_ssl_ciphersuite_t *pmVar12;
  time_t tVar13;
  long lVar14;
  char *pcVar15;
  undefined4 uVar16;
  uint ext_size;
  uint ext_id;
  uint32_t t;
  mbedtls_ssl_ciphersuite_t *suite_info;
  int handshake_failure;
  int renegotiation_info_seen;
  uchar comp;
  uchar *ext;
  uchar *buf;
  size_t ext_len;
  size_t n;
  int i;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  bVar4 = false;
  bVar5 = false;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
             ,0x582,"=> parse server hello");
  _renegotiation_info_seen = ssl->in_msg;
  ssl_local._4_4_ = mbedtls_ssl_read_record(ssl);
  if (ssl_local._4_4_ == 0) {
    if (ssl->in_msgtype == 0x16) {
      if ((*(uint *)&ssl->conf->field_0x174 >> 1 & 1) == 1) {
        if (*_renegotiation_info_seen == '\x03') {
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x5a9,"received hello verify request");
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x5aa,"<= parse server hello");
          iVar6 = ssl_parse_hello_verify_request(ssl);
          return iVar6;
        }
        free(ssl->handshake->verify_cookie);
        ssl->handshake->verify_cookie = (uchar *)0x0;
        ssl->handshake->verify_cookie_len = '\0';
      }
      uVar10 = ssl->in_hslen;
      sVar9 = mbedtls_ssl_hs_hdr_len(ssl);
      if ((uVar10 < sVar9 + 0x26) || (*_renegotiation_info_seen != '\x02')) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x5ba,"bad server hello message");
        ssl_local._4_4_ = -0x7980;
      }
      else {
        sVar9 = mbedtls_ssl_hs_hdr_len(ssl);
        _renegotiation_info_seen = _renegotiation_info_seen + sVar9;
        uVar16 = 0;
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x5cb,"server hello, version",_renegotiation_info_seen,2);
        mbedtls_ssl_read_version
                  (&ssl->major_ver,&ssl->minor_ver,*(uint *)&ssl->conf->field_0x174 >> 1 & 1,
                   _renegotiation_info_seen);
        if ((((ssl->major_ver < (int)(uint)ssl->conf->min_major_ver) ||
             (ssl->minor_ver < (int)(uint)ssl->conf->min_minor_ver)) ||
            ((int)(uint)ssl->conf->max_major_ver < ssl->major_ver)) ||
           ((int)(uint)ssl->conf->max_minor_ver < ssl->minor_ver)) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x5d8,
                     "server version out of bounds -  min: [%d:%d], server: [%d:%d], max: [%d:%d]",
                     (ulong)ssl->conf->min_major_ver,CONCAT44(uVar16,(uint)ssl->conf->min_minor_ver)
                     ,ssl->major_ver,ssl->minor_ver,(uint)ssl->conf->max_major_ver,
                     (uint)ssl->conf->max_minor_ver);
          mbedtls_ssl_send_alert_message(ssl,'\x02','F');
          ssl_local._4_4_ = -0x6e80;
        }
        else {
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x5e5,"server hello, current time: %lu",
                     (ulong)((uint)_renegotiation_info_seen[2] << 0x18 |
                             (uint)_renegotiation_info_seen[3] << 0x10 |
                             (uint)_renegotiation_info_seen[4] << 8 |
                            (uint)_renegotiation_info_seen[5]));
          pmVar1 = ssl->handshake;
          *(undefined8 *)(pmVar1->randbytes + 0x20) = *(undefined8 *)(_renegotiation_info_seen + 2);
          *(undefined8 *)(pmVar1->randbytes + 0x28) = *(undefined8 *)(_renegotiation_info_seen + 10)
          ;
          *(undefined8 *)(pmVar1->randbytes + 0x30) =
               *(undefined8 *)(_renegotiation_info_seen + 0x12);
          *(undefined8 *)(pmVar1->randbytes + 0x38) =
               *(undefined8 *)(_renegotiation_info_seen + 0x1a);
          uVar10 = (ulong)_renegotiation_info_seen[0x22];
          mbedtls_debug_print_buf
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x5ec,"server hello, random bytes",_renegotiation_info_seen + 2,0x20);
          if (uVar10 < 0x21) {
            uVar2 = ssl->in_hslen;
            sVar9 = mbedtls_ssl_hs_hdr_len(ssl);
            if (sVar9 + 0x27 + uVar10 < uVar2) {
              buf = (uchar *)(long)(int)(uint)CONCAT11(_renegotiation_info_seen[uVar10 + 0x26],
                                                       _renegotiation_info_seen[uVar10 + 0x27]);
              if (((buf != (uchar *)0x0) && (buf < (uchar *)0x4)) ||
                 (puVar3 = (uchar *)ssl->in_hslen, sVar9 = mbedtls_ssl_hs_hdr_len(ssl),
                 puVar3 != buf + sVar9 + 0x28 + uVar10)) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                           ,0x5fc,"bad server hello message");
                return -0x7980;
              }
            }
            else {
              sVar9 = ssl->in_hslen;
              sVar11 = mbedtls_ssl_hs_hdr_len(ssl);
              if (sVar9 != sVar11 + 0x26 + uVar10) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                           ,0x606,"bad server hello message");
                return -0x7980;
              }
              buf = (uchar *)0x0;
            }
            uVar7 = (uint)CONCAT11(_renegotiation_info_seen[uVar10 + 0x23],
                                   _renegotiation_info_seen[uVar10 + 0x24]);
            if (_renegotiation_info_seen[uVar10 + 0x25] == 0) {
              pmVar12 = mbedtls_ssl_ciphersuite_from_id(uVar7);
              ssl->transform_negotiate->ciphersuite_info = pmVar12;
              if (ssl->transform_negotiate->ciphersuite_info == (mbedtls_ssl_ciphersuite_t *)0x0) {
                mbedtls_debug_print_msg
                          (ssl,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                           ,0x62c,"ciphersuite info for %04x not found",(ulong)uVar7);
                ssl_local._4_4_ = -0x7100;
              }
              else {
                mbedtls_ssl_optimize_checksum(ssl,ssl->transform_negotiate->ciphersuite_info);
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                           ,0x632,"server hello, session id len.: %d",uVar10);
                mbedtls_debug_print_buf
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                           ,0x633,"server hello, session id",_renegotiation_info_seen + 0x23,uVar10)
                ;
                if (((ssl->handshake->resume == 0) || (uVar10 == 0)) ||
                   (((ssl->renego_status != 0 ||
                     (((ssl->session_negotiate->ciphersuite != uVar7 ||
                       (ssl->session_negotiate->compression != 0)) ||
                      (ssl->session_negotiate->id_len != uVar10)))) ||
                    (iVar6 = memcmp(ssl->session_negotiate->id,_renegotiation_info_seen + 0x23,
                                    uVar10), iVar6 != 0)))) {
                  ssl->state = ssl->state + 1;
                  ssl->handshake->resume = 0;
                  tVar13 = time((time_t *)0x0);
                  ssl->session_negotiate->start = tVar13;
                  ssl->session_negotiate->ciphersuite = uVar7;
                  ssl->session_negotiate->compression = 0;
                  ssl->session_negotiate->id_len = uVar10;
                  memcpy(ssl->session_negotiate->id,_renegotiation_info_seen + 0x23,uVar10);
                }
                else {
                  ssl->state = 0xc;
                  iVar6 = mbedtls_ssl_derive_keys(ssl);
                  if (iVar6 != 0) {
                    mbedtls_debug_print_ret
                              (ssl,1,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                               ,0x651,"mbedtls_ssl_derive_keys",iVar6);
                    return iVar6;
                  }
                }
                pcVar15 = "no";
                if (ssl->handshake->resume != 0) {
                  pcVar15 = "a";
                }
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                           ,0x657,"%s session has been resumed",pcVar15);
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                           ,0x659,"server hello, chosen ciphersuite: %04x",(ulong)uVar7);
                mbedtls_debug_print_msg
                          (ssl,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                           ,0x65a,"server hello, compress alg.: %d",
                           (ulong)_renegotiation_info_seen[uVar10 + 0x25]);
                pmVar12 = mbedtls_ssl_ciphersuite_from_id(ssl->session_negotiate->ciphersuite);
                if ((pmVar12 == (mbedtls_ssl_ciphersuite_t *)0x0) ||
                   (((*(uint *)&ssl->conf->field_0x174 >> 6 & 1) != 0 &&
                    (pmVar12->cipher == MBEDTLS_CIPHER_ARC4_128)))) {
                  mbedtls_debug_print_msg
                            (ssl,1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                             ,0x664,"bad server hello message");
                  ssl_local._4_4_ = -0x7980;
                }
                else {
                  mbedtls_debug_print_msg
                            (ssl,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                             ,0x668,"server hello, chosen ciphersuite: %s",pmVar12->name);
                  n._0_4_ = 0;
                  do {
                    if (ssl->conf->ciphersuite_list[ssl->minor_ver][(int)n] == 0) {
                      mbedtls_debug_print_msg
                                (ssl,1,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                 ,0x66f,"bad server hello message");
                      return -0x7980;
                    }
                    lVar14 = (long)(int)n;
                    n._0_4_ = (int)n + 1;
                  } while (ssl->conf->ciphersuite_list[ssl->minor_ver][lVar14] !=
                           ssl->session_negotiate->ciphersuite);
                  ssl->session_negotiate->compression = 0;
                  _renegotiation_info_seen = _renegotiation_info_seen + uVar10 + 0x28;
                  mbedtls_debug_print_msg
                            (ssl,2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                             ,0x687,"server hello, total extension length: %d",buf);
                  do {
                    if (buf == (uchar *)0x0) {
                      if ((ssl->secure_renegotiation == 0) &&
                         ((*(uint *)&ssl->conf->field_0x174 >> 4 & 3) == 2)) {
                        mbedtls_debug_print_msg
                                  (ssl,1,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                   ,0x720,"legacy renegotiation, breaking off handshake");
                        bVar5 = true;
                      }
                      else if ((ssl->renego_status != 1) ||
                              ((ssl->secure_renegotiation != 1 || (bVar4)))) {
                        if ((ssl->renego_status == 1) &&
                           ((ssl->secure_renegotiation == 0 &&
                            ((*(uint *)&ssl->conf->field_0x174 >> 4 & 3) == 0)))) {
                          mbedtls_debug_print_msg
                                    (ssl,1,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                     ,0x72f,"legacy renegotiation not allowed");
                          bVar5 = true;
                        }
                        else if ((ssl->renego_status == 1) &&
                                ((ssl->secure_renegotiation == 0 && (bVar4)))) {
                          mbedtls_debug_print_msg
                                    (ssl,1,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                     ,0x736,"renegotiation_info extension present (legacy)");
                          bVar5 = true;
                        }
                      }
                      else {
                        mbedtls_debug_print_msg
                                  (ssl,1,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                   ,0x728,"renegotiation_info extension missing (secure)");
                        bVar5 = true;
                      }
                      if (bVar5) {
                        iVar6 = mbedtls_ssl_send_fatal_handshake_failure(ssl);
                        if (iVar6 != 0) {
                          return iVar6;
                        }
                        return -0x7980;
                      }
                      mbedtls_debug_print_msg
                                (ssl,2,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                 ,0x743,"<= parse server hello");
                      return 0;
                    }
                    uVar7 = (uint)CONCAT11(*_renegotiation_info_seen,_renegotiation_info_seen[1]);
                    uVar8 = (uint)CONCAT11(_renegotiation_info_seen[2],_renegotiation_info_seen[3]);
                    if (buf < (uchar *)(ulong)(uVar8 + 4)) {
                      mbedtls_debug_print_msg
                                (ssl,1,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                 ,0x692,"bad server hello message");
                      return -0x7980;
                    }
                    if (uVar7 == 1) {
                      mbedtls_debug_print_msg
                                (ssl,3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                 ,0x6a6,"found max_fragment_length extension");
                      iVar6 = ssl_parse_max_fragment_length_ext
                                        (ssl,_renegotiation_info_seen + 4,(ulong)uVar8);
joined_r0x001210db:
                      if (iVar6 != 0) {
                        return iVar6;
                      }
                    }
                    else {
                      if (uVar7 == 4) {
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                   ,0x6b3,"found truncated_hmac extension");
                        iVar6 = ssl_parse_truncated_hmac_ext
                                          (ssl,_renegotiation_info_seen + 4,(ulong)uVar8);
                        goto joined_r0x001210db;
                      }
                      if (uVar7 == 0xb) {
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                   ,0x6e8,"found supported_point_formats extension");
                        iVar6 = ssl_parse_supported_point_formats_ext
                                          (ssl,_renegotiation_info_seen + 4,(ulong)uVar8);
                        goto joined_r0x001210db;
                      }
                      if (uVar7 == 0x10) {
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                   ,0x703,"found alpn extension");
                        iVar6 = ssl_parse_alpn_ext(ssl,_renegotiation_info_seen + 4,(ulong)uVar8);
                        goto joined_r0x001210db;
                      }
                      if (uVar7 == 0x16) {
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                   ,0x6c0,"found encrypt_then_mac extension");
                        iVar6 = ssl_parse_encrypt_then_mac_ext
                                          (ssl,_renegotiation_info_seen + 4,(ulong)uVar8);
                        goto joined_r0x001210db;
                      }
                      if (uVar7 == 0x17) {
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                   ,0x6cd,"found extended_master_secret extension");
                        iVar6 = ssl_parse_extended_ms_ext
                                          (ssl,_renegotiation_info_seen + 4,(ulong)uVar8);
                        goto joined_r0x001210db;
                      }
                      if (uVar7 == 0x23) {
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                   ,0x6da,"found session_ticket extension");
                        iVar6 = ssl_parse_session_ticket_ext
                                          (ssl,_renegotiation_info_seen + 4,(ulong)uVar8);
                        goto joined_r0x001210db;
                      }
                      if (uVar7 == 0xff01) {
                        mbedtls_debug_print_msg
                                  (ssl,3,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                   ,0x699,"found renegotiation extension");
                        bVar4 = true;
                        iVar6 = ssl_parse_renegotiation_info
                                          (ssl,_renegotiation_info_seen + 4,(ulong)uVar8);
                        goto joined_r0x001210db;
                      }
                      mbedtls_debug_print_msg
                                (ssl,3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                                 ,0x70d,"unknown extension found: %d (ignoring)",(ulong)uVar7);
                    }
                    buf = buf + -(ulong)(uVar8 + 4);
                    _renegotiation_info_seen = _renegotiation_info_seen + (uVar8 + 4);
                  } while ((buf == (uchar *)0x0) || ((uchar *)0x3 < buf));
                  mbedtls_debug_print_msg
                            (ssl,1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                             ,0x715,"bad server hello message");
                  ssl_local._4_4_ = -0x7980;
                }
              }
            }
            else {
              mbedtls_debug_print_msg
                        (ssl,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                         ,0x621,"server hello, bad compression: %d",
                         (ulong)_renegotiation_info_seen[uVar10 + 0x25]);
              ssl_local._4_4_ = -0x7080;
            }
          }
          else {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                       ,0x5f0,"bad server hello message");
            ssl_local._4_4_ = -0x7980;
          }
        }
      }
    }
    else if (ssl->renego_status == 1) {
      ssl->renego_records_seen = ssl->renego_records_seen + 1;
      if ((ssl->conf->renego_max_records < 0) ||
         (ssl->renego_records_seen <= ssl->conf->renego_max_records)) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x59b,"non-handshake message during renego");
        ssl_local._4_4_ = -0x6b00;
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x597,"renegotiation requested, but not honored by server");
        ssl_local._4_4_ = -0x7700;
      }
    }
    else {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x5a0,"bad server hello message");
      ssl_local._4_4_ = -0x7700;
    }
  }
  else {
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x588,"mbedtls_ssl_read_record",ssl_local._4_4_);
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_server_hello( mbedtls_ssl_context *ssl )
{
    int ret, i;
    size_t n;
    size_t ext_len;
    unsigned char *buf, *ext;
    unsigned char comp;
#if defined(MBEDTLS_ZLIB_SUPPORT)
    int accept_comp;
#endif
#if defined(MBEDTLS_SSL_RENEGOTIATION)
    int renegotiation_info_seen = 0;
#endif
    int handshake_failure = 0;
    const mbedtls_ssl_ciphersuite_t *suite_info;
#if defined(MBEDTLS_DEBUG_C)
    uint32_t t;
#endif

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse server hello" ) );

    buf = ssl->in_msg;

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
#if defined(MBEDTLS_SSL_RENEGOTIATION)
        if( ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_IN_PROGRESS )
        {
            ssl->renego_records_seen++;

            if( ssl->conf->renego_max_records >= 0 &&
                ssl->renego_records_seen > ssl->conf->renego_max_records )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "renegotiation requested, "
                                    "but not honored by server" ) );
                return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
            }

            MBEDTLS_SSL_DEBUG_MSG( 1, ( "non-handshake message during renego" ) );
            return( MBEDTLS_ERR_SSL_WAITING_SERVER_HELLO_RENEGO );
        }
#endif /* MBEDTLS_SSL_RENEGOTIATION */

        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        if( buf[0] == MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "received hello verify request" ) );
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse server hello" ) );
            return( ssl_parse_hello_verify_request( ssl ) );
        }
        else
        {
            /* We made it through the verification process */
            mbedtls_free( ssl->handshake->verify_cookie );
            ssl->handshake->verify_cookie = NULL;
            ssl->handshake->verify_cookie_len = 0;
        }
    }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

    if( ssl->in_hslen < 38 + mbedtls_ssl_hs_hdr_len( ssl ) ||
        buf[0] != MBEDTLS_SSL_HS_SERVER_HELLO )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    /*
     *  0   .  1    server_version
     *  2   . 33    random (maybe including 4 bytes of Unix time)
     * 34   . 34    session_id length = n
     * 35   . 34+n  session_id
     * 35+n . 36+n  cipher_suite
     * 37+n . 37+n  compression_method
     *
     * 38+n . 39+n  extensions length (optional)
     * 40+n .  ..   extensions
     */
    buf += mbedtls_ssl_hs_hdr_len( ssl );

    MBEDTLS_SSL_DEBUG_BUF( 3, "server hello, version", buf + 0, 2 );
    mbedtls_ssl_read_version( &ssl->major_ver, &ssl->minor_ver,
                      ssl->conf->transport, buf + 0 );

    if( ssl->major_ver < ssl->conf->min_major_ver ||
        ssl->minor_ver < ssl->conf->min_minor_ver ||
        ssl->major_ver > ssl->conf->max_major_ver ||
        ssl->minor_ver > ssl->conf->max_minor_ver )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "server version out of bounds - "
                            " min: [%d:%d], server: [%d:%d], max: [%d:%d]",
                            ssl->conf->min_major_ver, ssl->conf->min_minor_ver,
                            ssl->major_ver, ssl->minor_ver,
                            ssl->conf->max_major_ver, ssl->conf->max_minor_ver ) );

        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                     MBEDTLS_SSL_ALERT_MSG_PROTOCOL_VERSION );

        return( MBEDTLS_ERR_SSL_BAD_HS_PROTOCOL_VERSION );
    }

#if defined(MBEDTLS_DEBUG_C)
    t = ( (uint32_t) buf[2] << 24 )
      | ( (uint32_t) buf[3] << 16 )
      | ( (uint32_t) buf[4] <<  8 )
      | ( (uint32_t) buf[5]       );
    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, current time: %lu", t ) );
#endif

    memcpy( ssl->handshake->randbytes + 32, buf + 2, 32 );

    n = buf[34];

    MBEDTLS_SSL_DEBUG_BUF( 3,   "server hello, random bytes", buf + 2, 32 );

    if( n > 32 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    if( ssl->in_hslen > mbedtls_ssl_hs_hdr_len( ssl ) + 39 + n )
    {
        ext_len = ( ( buf[38 + n] <<  8 )
                  | ( buf[39 + n]       ) );

        if( ( ext_len > 0 && ext_len < 4 ) ||
            ssl->in_hslen != mbedtls_ssl_hs_hdr_len( ssl ) + 40 + n + ext_len )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
        }
    }
    else if( ssl->in_hslen == mbedtls_ssl_hs_hdr_len( ssl ) + 38 + n )
    {
        ext_len = 0;
    }
    else
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    /* ciphersuite (used later) */
    i = ( buf[35 + n] << 8 ) | buf[36 + n];

    /*
     * Read and check compression
     */
    comp = buf[37 + n];

#if defined(MBEDTLS_ZLIB_SUPPORT)
    /* See comments in ssl_write_client_hello() */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        accept_comp = 0;
    else
#endif
        accept_comp = 1;

    if( comp != MBEDTLS_SSL_COMPRESS_NULL &&
        ( comp != MBEDTLS_SSL_COMPRESS_DEFLATE || accept_comp == 0 ) )
#else /* MBEDTLS_ZLIB_SUPPORT */
    if( comp != MBEDTLS_SSL_COMPRESS_NULL )
#endif/* MBEDTLS_ZLIB_SUPPORT */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "server hello, bad compression: %d", comp ) );
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
    }

    /*
     * Initialize update checksum functions
     */
    ssl->transform_negotiate->ciphersuite_info = mbedtls_ssl_ciphersuite_from_id( i );

    if( ssl->transform_negotiate->ciphersuite_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "ciphersuite info for %04x not found", i ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    mbedtls_ssl_optimize_checksum( ssl, ssl->transform_negotiate->ciphersuite_info );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, session id len.: %d", n ) );
    MBEDTLS_SSL_DEBUG_BUF( 3,   "server hello, session id", buf + 35, n );

    /*
     * Check if the session can be resumed
     */
    if( ssl->handshake->resume == 0 || n == 0 ||
#if defined(MBEDTLS_SSL_RENEGOTIATION)
        ssl->renego_status != MBEDTLS_SSL_INITIAL_HANDSHAKE ||
#endif
        ssl->session_negotiate->ciphersuite != i ||
        ssl->session_negotiate->compression != comp ||
        ssl->session_negotiate->id_len != n ||
        memcmp( ssl->session_negotiate->id, buf + 35, n ) != 0 )
    {
        ssl->state++;
        ssl->handshake->resume = 0;
#if defined(MBEDTLS_HAVE_TIME)
        ssl->session_negotiate->start = mbedtls_time( NULL );
#endif
        ssl->session_negotiate->ciphersuite = i;
        ssl->session_negotiate->compression = comp;
        ssl->session_negotiate->id_len = n;
        memcpy( ssl->session_negotiate->id, buf + 35, n );
    }